

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O1

int Dar2_LibCutMatch(Gia_Man_t *p,Vec_Int_t *vCutLits,uint uTruth)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *p_00;
  Dar_Lib_t *pDVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  Gia_Obj_t *pGVar9;
  long lVar10;
  
  if (vCutLits->nSize != 4) {
    __assert_fail("Vec_IntSize(vCutLits) == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darLib.c"
                  ,0x425,"int Dar2_LibCutMatch(Gia_Man_t *, Vec_Int_t *, unsigned int)");
  }
  uVar7 = (ulong)(uint)vCutLits->nSize;
  if (0 < vCutLits->nSize) {
    cVar1 = s_DarLib->pPhases[uTruth];
    pcVar3 = s_DarLib->pPerms4[s_DarLib->pPerms[uTruth]];
    lVar10 = 0;
    lVar8 = 0;
    do {
      pDVar5 = s_DarLib;
      cVar2 = pcVar3[lVar8];
      if ((cVar2 < '\0') || ((int)uVar7 <= (int)cVar2)) {
LAB_0048d222:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (vCutLits->pArray[(uint)(int)cVar2] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10f,"int Abc_LitNotCond(int, int)");
      }
      *(uint *)(s_DarLib->pDatas->nLats + lVar10 + -0x15) =
           vCutLits->pArray[(uint)(int)cVar2] ^
           (uint)(((uint)(int)cVar1 >> ((uint)lVar8 & 0x1f) & 1) != 0);
      uVar6 = *(uint *)(pDVar5->pDatas->nLats + lVar10 + -0x15);
      if ((int)uVar6 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10c,"int Abc_Lit2Var(int)");
      }
      uVar6 = uVar6 >> 1;
      if (p->nObjs <= (int)uVar6) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar4 = p->pObjs;
      pGVar9 = (Gia_Obj_t *)((ulong)(pGVar4 + uVar6) & 0xfffffffffffffffe);
      if ((pGVar9 < pGVar4) || (pGVar4 + p->nObjs <= pGVar9)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar6 = (int)((long)pGVar9 - (long)pGVar4 >> 2) * -0x55555555;
      p_00 = p->vLevels;
      Vec_IntFillExtra(p_00,uVar6 + 1,(int)pGVar4);
      if (((int)uVar6 < 0) || (p_00->nSize <= (int)uVar6)) goto LAB_0048d222;
      *(int *)(s_DarLib->pDatas->nLats + lVar10 + -0xd) = p_00->pArray[uVar6 & 0x7fffffff];
      lVar8 = lVar8 + 1;
      uVar7 = (ulong)vCutLits->nSize;
      lVar10 = lVar10 + 0x18;
    } while (lVar8 < (long)uVar7);
  }
  return 1;
}

Assistant:

int Dar2_LibCutMatch( Gia_Man_t * p, Vec_Int_t * vCutLits, unsigned uTruth )
{
    unsigned uPhase;
    char * pPerm;
    int i;
    assert( Vec_IntSize(vCutLits) == 4 );
    // get the fanin permutation
    uPhase = s_DarLib->pPhases[uTruth];
    pPerm  = s_DarLib->pPerms4[ (int)s_DarLib->pPerms[uTruth] ];
    // collect fanins with the corresponding permutation/phase
    for ( i = 0; i < Vec_IntSize(vCutLits); i++ )
    {
//        pFanin = Gia_ManObj( p, pCut->pLeaves[ (int)pPerm[i] ] );
//        pFanin = Gia_ManObj( p, Vec_IntEntry( vCutLits, (int)pPerm[i] ) );
//        pFanin = Gia_ObjFromLit( p, Vec_IntEntry( vCutLits, (int)pPerm[i] ) );
        s_DarLib->pDatas[i].iGunc = Abc_LitNotCond( Vec_IntEntry(vCutLits, (int)pPerm[i]), ((uPhase >> i) & 1) );
        s_DarLib->pDatas[i].Level = Gia_ObjLevel( p, Gia_Regular(Gia_ObjFromLit(p, s_DarLib->pDatas[i].iGunc)) );
    }
    return 1;
}